

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O2

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::GenerateCreateEnumStmt
          (Transformer *this,
          unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
          *entry)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> _Var5;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> _Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var8;
  pointer pCVar9;
  pointer pCVar10;
  pointer pPVar11;
  pointer pSVar12;
  pointer pOVar13;
  pointer pSVar14;
  pointer pCVar15;
  unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
  *in_RDX;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var16;
  OrderByNullType local_a2;
  OrderType local_a1;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_a0;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_98;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_90
  ;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_88;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> local_80;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_78;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_70;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  local_68;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  
  make_uniq<duckdb::CreateStatement>();
  make_uniq<duckdb::CreateTypeInfo>();
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  (pCVar9->super_CreateInfo).temporary = true;
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  (pCVar9->super_CreateInfo).internal = false;
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  ::std::__cxx11::string::assign((char *)&(pCVar9->super_CreateInfo).catalog);
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  ::std::__cxx11::string::assign((char *)&(pCVar9->super_CreateInfo).schema);
  pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
            ::operator->(in_RDX);
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  ::std::__cxx11::string::operator=((string *)&pCVar9->name,(string *)pCVar10);
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  (pCVar9->super_CreateInfo).on_conflict = REPLACE_ON_CONFLICT;
  pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
            ::operator->(in_RDX);
  if ((pCVar10->subquery).
      super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) {
    pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    local_a0._M_head_impl =
         (pCVar10->base).
         super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (pCVar10->base).super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&pCVar10->column);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_60,pPVar11);
    make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_68,&LogicalType::VARCHAR,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_60);
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_a0);
    _local_58 = (QueryNode *)
                local_68.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_68.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)(ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar12->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&stack0xffffffffffffffa8);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )_local_58 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)_local_58 + 8))();
    }
    local_58 = 0xf;
    pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_70,&stack0xffffffffffffffa8,&pCVar10->column);
    _Var7._M_head_impl = local_70._M_head_impl;
    local_70._M_head_impl = (ParsedExpression *)0x0;
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_a0);
    _Var1._M_head_impl =
         (pSVar12->where_clause).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar12->where_clause).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_a0);
    make_uniq<duckdb::DistinctModifier>();
    _local_58 = (QueryNode *)
                local_90._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_90._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(pSVar12->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)&stack0xffffffffffffffa8);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )_local_58 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)_local_58 + 8))();
    }
    _local_58 = (QueryNode *)0x0;
    if (local_90._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      (**(code **)(*(long *)local_90._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
    make_uniq<duckdb::OrderModifier>();
    pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)&local_90);
    local_a1 = ASCENDING;
    local_a2 = ORDER_DEFAULT;
    Value::INTEGER((Value *)&stack0xffffffffffffffa8,1);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>
              ((duckdb *)&local_88,(Value *)&stack0xffffffffffffffa8);
    ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
    emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
              ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pOVar13->orders,
               &local_a1,&local_a2,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                *)&local_88);
    if (local_88._M_head_impl != (ConstantExpression *)0x0) {
      (*((local_88._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
    local_88._M_head_impl = (ConstantExpression *)0x0;
    Value::~Value((Value *)&stack0xffffffffffffffa8);
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_a0);
    _local_58 = (QueryNode *)
                local_90._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_90._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(pSVar12->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)&stack0xffffffffffffffa8);
    if (_local_58 != (QueryNode *)0x0) {
      (*(((ParsedExpression *)_local_58)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    _Var16._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl = (SelectNode *)0x0;
    if (local_90._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      (**(code **)(*(long *)local_90._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
    if (local_70._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_68.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      (*((BaseExpression *)
        local_68.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
        _vptr_BaseExpression[1])();
    }
    if (local_60._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_a0._M_head_impl != (SelectNode *)0x0) {
      (*((local_a0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  else {
    pCVar10 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    _Var16._M_head_impl =
         (SelectNode *)
         (pCVar10->subquery).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar10->subquery).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
    ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  }
  make_uniq<duckdb::SelectStatement>();
  local_78._M_head_impl = &(_Var16._M_head_impl)->super_QueryNode;
  TransformMaterializedCTE
            ((Transformer *)&stack0xffffffffffffffa8,
             (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_78);
  pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)&local_a0);
  _Var8._M_head_impl = _local_58;
  _local_58 = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pSVar14->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar14->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )_local_58 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)_local_58 + 8))();
    }
  }
  _local_58 = (QueryNode *)0x0;
  if ((SelectNode *)local_78._M_head_impl != (SelectNode *)0x0) {
    (*((QueryNode *)&(local_78._M_head_impl)->_vptr_QueryNode)->_vptr_QueryNode[1])();
  }
  _Var16._M_head_impl = local_a0._M_head_impl;
  local_78._M_head_impl = (QueryNode *)0x0;
  local_a0._M_head_impl = (SelectNode *)0x0;
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  _Var3._M_head_impl =
       (pCVar9->query).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pCVar9->query).super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
  ._M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (SQLStatement *)_Var16._M_head_impl;
  if (_Var3._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffa8,INVALID);
  pCVar9 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_98);
  LogicalType::operator=(&pCVar9->type,(LogicalType *)&stack0xffffffffffffffa8);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffa8);
  _Var5._M_head_impl = local_98._M_head_impl;
  local_98._M_head_impl = (CreateTypeInfo *)0x0;
  pCVar15 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
            ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                          *)&local_80);
  _Var4._M_head_impl =
       (pCVar15->info).
       super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar15->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       &(_Var5._M_head_impl)->super_CreateInfo;
  if (_Var4._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
  }
  _Var6._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (CreateStatement *)0x0;
  (this->parent).ptr = (Transformer *)_Var6._M_head_impl;
  if (local_a0._M_head_impl != (SelectNode *)0x0) {
    (*((local_a0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
  }
  if (local_98._M_head_impl != (CreateTypeInfo *)0x0) {
    (*((local_98._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  if (local_80._M_head_impl != (CreateStatement *)0x0) {
    (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::GenerateCreateEnumStmt(unique_ptr<CreatePivotEntry> entry) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateTypeInfo>();

	info->temporary = true;
	info->internal = false;
	info->catalog = INVALID_CATALOG;
	info->schema = INVALID_SCHEMA;
	info->name = std::move(entry->enum_name);
	info->on_conflict = OnCreateConflict::REPLACE_ON_CONFLICT;

	// generate the query that will result in the enum creation
	unique_ptr<QueryNode> subselect;
	if (!entry->subquery) {
		auto select_node = std::move(entry->base);
		auto columnref = entry->column->Copy();
		auto cast = make_uniq<CastExpression>(LogicalType::VARCHAR, std::move(columnref));
		select_node->select_list.push_back(std::move(cast));

		auto is_not_null =
		    make_uniq<OperatorExpression>(ExpressionType::OPERATOR_IS_NOT_NULL, std::move(entry->column));
		select_node->where_clause = std::move(is_not_null);

		// order by the column
		select_node->modifiers.push_back(make_uniq<DistinctModifier>());
		auto modifier = make_uniq<OrderModifier>();
		modifier->orders.emplace_back(OrderType::ASCENDING, OrderByNullType::ORDER_DEFAULT,
		                              make_uniq<ConstantExpression>(Value::INTEGER(1)));
		select_node->modifiers.push_back(std::move(modifier));
		subselect = std::move(select_node);
	} else {
		subselect = std::move(entry->subquery);
	}

	auto select = make_uniq<SelectStatement>();
	select->node = TransformMaterializedCTE(std::move(subselect));
	info->query = std::move(select);
	info->type = LogicalType::INVALID;

	result->info = std::move(info);
	return std::move(result);
}